

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this_00;
  Impl *this_01;
  ulong uVar1;
  uchar *puVar2;
  ssize_t in_RAX;
  long lVar3;
  ssize_t extraout_RAX;
  uint64_t uVar4;
  undefined4 in_register_00000034;
  Fault f;
  uint64_t offset_local;
  uint64_t end;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  offset_local = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    this_00 = &this->impl;
    _kjCondition.left = (unsigned_long *)((ulong)_kjCondition.left & 0xffffffffffffff00);
    _::Mutex::lock(&this_00->mutex,0,&_kjCondition);
    this_01 = &(this->impl).value;
    lock.mutex = &this_00->mutex;
    lock.ptr = this_01;
    lVar3 = (*(code *)**(undefined8 **)(this->impl).value.clock)();
    (this->impl).value.lastModified.value.value = lVar3;
    _kjCondition.right = &offset_local;
    end = offset_local + __n;
    _kjCondition.left = &end;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = end >= offset_local;
    if (end < offset_local) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[33]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x34a,FAILED,"end >= offset","_kjCondition,\"write() request overflows uint64\"",
                 &_kjCondition,(char (*) [33])"write() request overflows uint64");
      _::Debug::Fault::fatal(&f);
    }
    Impl::ensureCapacity(this_01,end);
    uVar1 = (this->impl).value.size;
    uVar4 = end;
    if (end < uVar1) {
      uVar4 = uVar1;
    }
    puVar2 = (this->impl).value.bytes.ptr;
    (this->impl).value.size = uVar4;
    memcpy(puVar2 + offset_local,__buf,__n);
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }